

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratiotest.cpp
# Opt level: O3

Instance * ratiotest_relax_instance(Instance *__return_storage_ptr__,Runtime *runtime)

{
  double *pdVar1;
  double *bound;
  double *pdVar2;
  
  Instance::Instance(__return_storage_ptr__,&runtime->instance);
  pdVar1 = (__return_storage_ptr__->con_lo).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pdVar2 = (__return_storage_ptr__->con_lo).super__Vector_base<double,_std::allocator<double>_>
                ._M_impl.super__Vector_impl_data._M_start; pdVar2 != pdVar1; pdVar2 = pdVar2 + 1) {
    if (-INFINITY < *pdVar2) {
      *pdVar2 = *pdVar2 - (runtime->settings).ratiotest_d;
    }
  }
  pdVar1 = (__return_storage_ptr__->con_up).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pdVar2 = (__return_storage_ptr__->con_up).super__Vector_base<double,_std::allocator<double>_>
                ._M_impl.super__Vector_impl_data._M_start; pdVar2 != pdVar1; pdVar2 = pdVar2 + 1) {
    if (*pdVar2 < INFINITY) {
      *pdVar2 = *pdVar2 + (runtime->settings).ratiotest_d;
    }
  }
  pdVar1 = (__return_storage_ptr__->var_lo).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pdVar2 = (__return_storage_ptr__->var_lo).super__Vector_base<double,_std::allocator<double>_>
                ._M_impl.super__Vector_impl_data._M_start; pdVar2 != pdVar1; pdVar2 = pdVar2 + 1) {
    if (-INFINITY < *pdVar2) {
      *pdVar2 = *pdVar2 - (runtime->settings).ratiotest_d;
    }
  }
  pdVar1 = (__return_storage_ptr__->var_up).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pdVar2 = (__return_storage_ptr__->var_up).super__Vector_base<double,_std::allocator<double>_>
                ._M_impl.super__Vector_impl_data._M_start; pdVar2 != pdVar1; pdVar2 = pdVar2 + 1) {
    if (*pdVar2 < INFINITY) {
      *pdVar2 = *pdVar2 + (runtime->settings).ratiotest_d;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Instance ratiotest_relax_instance(Runtime& runtime) {
  Instance relaxed_instance = runtime.instance;
  for (double& bound : relaxed_instance.con_lo) {
    if (bound != -std::numeric_limits<double>::infinity()) {
      bound -= runtime.settings.ratiotest_d;
    }
  }

  for (double& bound : relaxed_instance.con_up) {
    if (bound != std::numeric_limits<double>::infinity()) {
      bound += runtime.settings.ratiotest_d;
    }
  }

  for (double& bound : relaxed_instance.var_lo) {
    if (bound != -std::numeric_limits<double>::infinity()) {
      bound -= runtime.settings.ratiotest_d;
    }
  }

  for (double& bound : relaxed_instance.var_up) {
    if (bound != std::numeric_limits<double>::infinity()) {
      bound += runtime.settings.ratiotest_d;
    }
  }
  return relaxed_instance;
}